

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_transfer_object(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  OBJ_DATA *obj;
  CHAR_DATA *ch_00;
  char *pcVar4;
  char arg2 [4608];
  char arg1 [4608];
  char local_2428 [4608];
  char local_1228 [4608];
  
  target_name = one_argument(target_name,local_1228);
  one_argument(target_name,local_2428);
  if ((local_1228[0] == '\0') || (local_2428[0] == '\0')) {
    pcVar4 = "Send what to whom?\n\r";
  }
  else {
    obj = get_obj_carry(ch,local_1228,ch);
    if (obj == (OBJ_DATA *)0x0) {
      pcVar4 = "You are not carrying that.\n\r";
    }
    else {
      ch_00 = get_char_world(ch,local_2428);
      if (ch_00 == (CHAR_DATA *)0x0) {
        pcVar4 = "They aren\'t here.\n\r";
      }
      else {
        bVar2 = is_npc(ch_00);
        if (bVar2) {
          pcVar4 = "They wouldn\'t want that sent to them.\n\r";
        }
        else if (ch_00 == ch) {
          pcVar4 = "Why not just hold it in your other hand?\n\r";
        }
        else {
          bVar2 = is_immortal(ch_00);
          if ((!bVar2) || (bVar2 = is_immortal(ch), bVar2)) {
            if ((obj->extra_flags[0] & 0x80) == 0) {
              sVar1 = ch_00->carry_number;
              iVar3 = can_carry_n(ch_00);
              if (((iVar3 <= sVar1) ||
                  (sVar1 = ch_00->carry_weight, iVar3 = can_carry_w(ch_00), iVar3 <= sVar1)) ||
                 (bVar2 = isCabalItem(obj), bVar2)) {
                act("$p glows softly but nothing happens.",ch,obj,(void *)0x0,3);
                pcVar4 = "$p glows softly but nothing happens.";
                ch_00 = ch;
              }
              else {
                if ((ch_00->act[0] & 0x80000) != 0) {
                  pcVar4 = "They wouldn\'t want them sent to them.\n\r";
                  goto LAB_002b4561;
                }
                act("$p glows softly and vanishes!",ch,obj,(void *)0x0,3);
                act("$p glows softly and vanishes!",ch,obj,(void *)0x0,0);
                obj_from_char(obj);
                obj_to_char(obj,ch_00);
                act("You suddenly feel heavier as $p pops into your inventory!",ch_00,obj,
                    (void *)0x0,3);
                pcVar4 = "$p suddenly appears from nowhere and pops into $n\'s possession!";
              }
              act(pcVar4,ch_00,obj,(void *)0x0,0);
              return;
            }
            pcVar4 = "You can\'t seem to remove it from yourself to prepare for transfer.\n\r";
          }
          else {
            pcVar4 = "You can\'t send to an immortal.\n\r";
          }
        }
      }
    }
  }
LAB_002b4561:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void spell_transfer_object(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];

	target_name = one_argument(target_name, arg1);
	one_argument(target_name, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Send what to whom?\n\r", ch);
		return;
	}

	if ((obj = get_obj_carry(ch, arg1, ch)) == nullptr)
	{
		send_to_char("You are not carrying that.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg2);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("They wouldn't want that sent to them.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Why not just hold it in your other hand?\n\r", ch);
		return;
	}

	if (is_immortal(victim) && !is_immortal(ch))
	{
		send_to_char("You can't send to an immortal.\n\r", ch);
		return;
	}

	if (IS_SET(obj->extra_flags, ITEM_NODROP))
	{
		send_to_char("You can't seem to remove it from yourself to prepare for transfer.\n\r", ch);
		return;
	}

	if (victim->carry_number >= can_carry_n(victim)
		|| victim->carry_weight >= can_carry_w(victim)
		|| isCabalItem(obj))
	{
		act("$p glows softly but nothing happens.", ch, obj, 0, TO_CHAR);
		act("$p glows softly but nothing happens.", ch, obj, 0, TO_ROOM);
		return;
	}

	if (IS_SET(victim->act, PLR_NO_TRANSFER))
	{
		send_to_char("They wouldn't want them sent to them.\n\r", ch);
		return;
	}

	act("$p glows softly and vanishes!", ch, obj, 0, TO_CHAR);
	act("$p glows softly and vanishes!", ch, obj, 0, TO_ROOM);

	obj_from_char(obj);
	obj_to_char(obj, victim);

	act("You suddenly feel heavier as $p pops into your inventory!", victim, obj, 0, TO_CHAR);
	act("$p suddenly appears from nowhere and pops into $n's possession!", victim, obj, 0, TO_ROOM);
}